

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenlibClientSubscription.c
# Opt level: O1

int GenlibClientSubscription_assign(GenlibClientSubscription *p,GenlibClientSubscription *q)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  
  if (p == q) {
    return 1;
  }
  p->m_RenewEventId = q->m_RenewEventId;
  pcVar2 = UpnpString_get_String(q->m_SID);
  iVar1 = UpnpString_set_String(p->m_SID,pcVar2);
  if (iVar1 != 0) {
    pcVar2 = UpnpString_get_String(q->m_ActualSID);
    iVar1 = UpnpString_set_String(p->m_ActualSID,pcVar2);
    if (iVar1 != 0) {
      pcVar2 = UpnpString_get_String(q->m_EventURL);
      iVar1 = UpnpString_set_String(p->m_EventURL,pcVar2);
      bVar3 = iVar1 != 0;
      goto LAB_00120b8f;
    }
  }
  bVar3 = false;
LAB_00120b8f:
  if (bVar3 != false) {
    p->m_Next = q->m_Next;
  }
  return (uint)bVar3;
}

Assistant:

int GenlibClientSubscription_assign(
	GenlibClientSubscription *p, const GenlibClientSubscription *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok &&
		     GenlibClientSubscription_set_RenewEventId(
			     p, GenlibClientSubscription_get_RenewEventId(q));
		ok = ok && GenlibClientSubscription_set_SID(
				   p, GenlibClientSubscription_get_SID(q));
		ok = ok && GenlibClientSubscription_set_ActualSID(p,
				   GenlibClientSubscription_get_ActualSID(q));
		ok = ok && GenlibClientSubscription_set_EventURL(
				   p, GenlibClientSubscription_get_EventURL(q));
		ok = ok && GenlibClientSubscription_set_Next(
				   p, GenlibClientSubscription_get_Next(q));
	}

	return ok;
}